

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O0

Error __thiscall
asmjit::v1_14::RAInstBuilder::addCallRet(RAInstBuilder *this,RAWorkReg *workReg,uint32_t outId)

{
  RATiedReg *this_00;
  byte bVar1;
  uint32_t *puVar2;
  uint32_t in_EDX;
  uint *in_RSI;
  uint *in_RDI;
  RATiedReg *tiedReg;
  RegMask outRegs;
  RegGroup group;
  RATiedFlags flags;
  char *in_stack_00000270;
  int in_stack_0000027c;
  char *in_stack_00000280;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  RegGroup group_00;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe8c;
  uint32_t local_134;
  uint *local_130;
  Error local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_fc;
  uint *local_f8;
  uint32_t *local_f0;
  uint *local_e8;
  uint *local_e0;
  uint *local_d8;
  uint32_t *local_d0;
  uint *local_c8;
  int local_c0;
  byte local_b9;
  uint *local_b8;
  int *local_b0;
  int *local_a8;
  uint local_a0;
  byte local_99;
  uint *local_98;
  uint *local_90;
  uint *local_88;
  RATiedReg *local_78;
  uint *local_70;
  uint local_64;
  uint *local_60;
  long local_58;
  undefined4 local_c;
  undefined4 *local_8;
  
  if (in_EDX == 0xff) {
    DebugUtils::assertionFailed(in_stack_00000280,in_stack_0000027c,in_stack_00000270);
  }
  local_10c = 8;
  local_110 = 2;
  local_114 = 10;
  local_118 = 0x80;
  local_fc = 0x8a;
  local_e0 = in_RSI + 8;
  bVar1 = (byte)(*local_e0 >> 8) & 0xf;
  local_f0 = &local_134;
  local_f8 = in_RDI + 2;
  *local_f8 = *local_f8 | 0x8a;
  local_134 = in_EDX;
  local_130 = in_RSI;
  local_d8 = local_e0;
  local_d0 = local_f0;
  puVar2 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                     ((RARegMask *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      (RegGroup *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  group_00 = (RegGroup)((uint)in_stack_fffffffffffffe84 >> 0x18);
  *puVar2 = 1 << ((byte)in_EDX & 0x1f) | *puVar2;
  local_b8 = in_RDI + 5;
  local_c0 = bVar1 + 8;
  local_b0 = &local_c0;
  *local_b8 = 1 << (sbyte)local_c0 | *local_b8;
  local_98 = in_RDI + 5;
  local_a0 = (uint)bVar1;
  local_90 = &local_a0;
  *local_98 = 1 << bVar1 | *local_98;
  local_c8 = local_130;
  local_58 = *(long *)(local_130 + 4);
  local_b9 = bVar1;
  local_a8 = local_b0;
  local_99 = bVar1;
  local_88 = local_90;
  if (local_58 == 0) {
    if (0x7f < (uint)(*(long *)(in_RDI + 0xe) - (long)(in_RDI + 0x10) >> 5)) {
      DebugUtils::assertionFailed(in_stack_00000280,in_stack_0000027c,in_stack_00000270);
    }
    this_00 = *(RATiedReg **)(in_RDI + 0xe);
    *(RATiedReg **)(in_RDI + 0xe) = this_00 + 1;
    local_e8 = local_130;
    local_c = 1;
    local_8 = &local_c;
    uVar3 = 0;
    RATiedReg::init(this_00,(EVP_PKEY_CTX *)(ulong)*local_130);
    local_70 = local_130;
    *(RATiedReg **)(local_130 + 4) = this_00;
    local_64 = *in_RDI;
    local_60 = local_130;
    local_130[10] = local_64;
    local_78 = this_00;
    RARegCount::add((RARegCount *)CONCAT44(in_stack_fffffffffffffe8c,uVar3),group_00,local_134);
    local_11c = 0;
  }
  else if (*(char *)(local_58 + 0xf) == -1) {
    *(char *)(local_58 + 0xc) = *(char *)(local_58 + 0xc) + '\x01';
    *(uint *)(local_58 + 8) = *(uint *)(local_58 + 8) | 0x8a;
    *(char *)(local_58 + 0xf) = (char)local_134;
    local_11c = 0;
  }
  else {
    local_11c = DebugUtils::errored(0x41);
  }
  return local_11c;
}

Assistant:

Error addCallRet(RAWorkReg* workReg, uint32_t outId) noexcept {
    ASMJIT_ASSERT(outId != BaseReg::kIdBad);

    RATiedFlags flags = RATiedFlags::kOut | RATiedFlags::kWrite | RATiedFlags::kOutFixed;
    RegGroup group = workReg->group();
    RegMask outRegs = Support::bitMask(outId);

    _aggregatedFlags |= flags;
    _used[group] |= outRegs;
    _stats.makeFixed(group);
    _stats.makeUsed(group);

    RATiedReg* tiedReg = workReg->tiedReg();
    if (!tiedReg) {
      // Could happen when the builder is not reset properly after each instruction.
      ASMJIT_ASSERT(tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs));

      tiedReg = _cur++;
      tiedReg->init(workReg->workId(), flags, Support::allOnes<RegMask>(), BaseReg::kIdBad, 0, outRegs, outId, 0);

      workReg->setTiedReg(tiedReg);
      workReg->assignBasicBlock(_basicBlockId);

      _count.add(group);
      return kErrorOk;
    }
    else {
      if (tiedReg->hasOutId())
        return DebugUtils::errored(kErrorOverlappedRegs);

      tiedReg->addRefCount();
      tiedReg->addFlags(flags);
      tiedReg->setOutId(outId);
      return kErrorOk;
    }
  }